

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O2

bool __thiscall
chrono::collision::ChCollisionModelBullet::Add2Dpath
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          shared_ptr<chrono::geometry::ChLinePath> *mpath,ChVector<double> *pos,
          ChMatrix33<double> *rot,double mthickness)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  undefined8 uVar3;
  bool bVar4;
  ChCollisionShapeBullet *pCVar5;
  cbt2DsegmentShape *this_00;
  cbt2DarcShape *pcVar6;
  ChException *pCVar7;
  ulong uVar8;
  ulong uVar9;
  float mzthickness;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  shared_ptr<chrono::geometry::ChLine> sVar15;
  ChVector<double> dir_prev;
  shared_ptr<chrono::geometry::ChLineArc> marc;
  shared_ptr<chrono::geometry::ChLineSegment> msegment;
  ChVector<double> dir_next;
  shared_ptr<chrono::geometry::ChLine> mline_next;
  shared_ptr<chrono::geometry::ChLine> mline_prev;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_118;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_f8;
  ChVector<double> v_1;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x24])(0);
  mzthickness = (float)mthickness;
  uVar8 = 0;
  do {
    peVar2 = (mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if ((ulong)((long)(peVar2->lines).
                      super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(peVar2->lines).
                      super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar8) {
      return true;
    }
    geometry::ChLinePath::GetSubLineN((ChLinePath *)&marc,(size_t)peVar2);
    std::dynamic_pointer_cast<chrono::geometry::ChLineSegment,chrono::geometry::ChLine>
              ((shared_ptr<chrono::geometry::ChLine> *)&msegment);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&marc.super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (msegment.super___shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      geometry::ChLinePath::GetSubLineN
                ((ChLinePath *)&dir_prev,
                 (size_t)(mpath->
                         super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr);
      std::dynamic_pointer_cast<chrono::geometry::ChLineArc,chrono::geometry::ChLine>
                ((shared_ptr<chrono::geometry::ChLine> *)&marc);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(dir_prev.m_data + 1));
      if (marc.super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        pCVar7 = (ChException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_90,
                   "Error! Add2Dpath: ChLinePath must contain only ChLineArc and/or ChLineSegment.",
                   (allocator *)&dir_prev);
        ChException::ChException(pCVar7,&local_90);
        __cxa_throw(pCVar7,&ChException::typeinfo,ChException::~ChException);
      }
      dVar10 = ((marc.super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->origin).rot.m_data[1];
      if ((dVar10 != 0.0) || (NAN(dVar10))) {
LAB_00d3a48d:
        pCVar7 = (ChException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_70,
                   "Error! Add2Dpath: a sub arc of ChLinePath not parallel to XY plane!",
                   (allocator *)&dir_prev);
        ChException::ChException(pCVar7,&local_70);
        __cxa_throw(pCVar7,&ChException::typeinfo,ChException::~ChException);
      }
      dVar10 = ((marc.super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->origin).rot.m_data[2];
      if ((dVar10 != 0.0) || (NAN(dVar10))) goto LAB_00d3a48d;
      dVar10 = (marc.super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->angle1;
      dVar11 = (marc.super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->angle2;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar10 - dVar11;
      uVar3 = vcmpsd_avx512f(auVar12,ZEXT816(0x401921fb54442d18),0);
      bVar4 = (bool)((byte)uVar3 & 1);
      pCVar5 = (ChCollisionShapeBullet *)::operator_new(0x28);
      std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_108,
                 &material->
                  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
      ChCollisionShapeBullet::ChCollisionShapeBullet
                (pCVar5,PATH2D,(shared_ptr<chrono::ChMaterialSurface> *)&local_108);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_108._M_refcount);
      pcVar6 = (cbt2DarcShape *)cbtConvexInternalShape::operator_new(0x60);
      cbt2DarcShape::cbt2DarcShape
                (pcVar6,(float)((marc.
                                 super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->origin).pos.m_data[0],
                 (float)((marc.
                          super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->origin).pos.m_data[1],
                 (float)(marc.
                         super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->radius,
                 (float)(double)((ulong)bVar4 * (long)(dVar10 + -1e-07) +
                                (ulong)!bVar4 * (long)dVar10),(float)dVar11,
                 (marc.super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->counterclockwise,mzthickness);
      pCVar5->m_bt_shape = (cbtCollisionShape *)pcVar6;
      (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
      (*(pcVar6->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0xb])(pcVar6);
      injectShape(this,pos,rot,pCVar5);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&marc.super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    else {
      dVar10 = ((msegment.
                 super___shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->pA).m_data[2];
      dVar11 = ((msegment.
                 super___shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->pB).m_data[2];
      if ((dVar10 != dVar11) || (NAN(dVar10) || NAN(dVar11))) {
        pCVar7 = (ChException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_50,
                   "Error! Add2Dpath: sub segment of ChLinePath not parallel to XY plane!",
                   (allocator *)&marc);
        ChException::ChException(pCVar7,&local_50);
        __cxa_throw(pCVar7,&ChException::typeinfo,ChException::~ChException);
      }
      marc.super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2> =
           (__shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>)
           vcvtpd2ps_avx(*(undefined1 (*) [16])
                          ((msegment.
                            super___shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->pA).m_data);
      dir_prev.m_data._0_16_ =
           vcvtpd2ps_avx(*(undefined1 (*) [16])
                          ((msegment.
                            super___shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->pB).m_data);
      pCVar5 = (ChCollisionShapeBullet *)::operator_new(0x28);
      std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_f8,
                 &material->
                  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
      ChCollisionShapeBullet::ChCollisionShapeBullet
                (pCVar5,PATH2D,(shared_ptr<chrono::ChMaterialSurface> *)&local_f8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_f8._M_refcount);
      this_00 = (cbt2DsegmentShape *)cbtConvexInternalShape::operator_new(0x68);
      cbt2DsegmentShape::cbt2DsegmentShape
                (this_00,(cbtVector3 *)&marc,(cbtVector3 *)&dir_prev,mzthickness);
      pCVar5->m_bt_shape = (cbtCollisionShape *)this_00;
      (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
      (*(this_00->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
        _vptr_cbtCollisionShape[0xb])(this_00);
      injectShape(this,pos,rot,pCVar5);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&msegment.
                super___shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    peVar2 = (mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    uVar9 = uVar8 + 1;
    if ((ulong)((long)(peVar2->lines).
                      super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(peVar2->lines).
                      super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar9) {
      (*(peVar2->super_ChLine).super_ChGeometry._vptr_ChGeometry[0x12])((ChLinePath *)&marc);
      (*(((mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr)->super_ChLine).super_ChGeometry._vptr_ChGeometry[0x13])(&dir_prev);
      msegment.super___shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2> =
           (__shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2>)
           vsubpd_avx((undefined1  [16])
                      marc.
                      super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>,
                      (undefined1  [16])dir_prev.m_data._0_16_);
      dVar10 = ChVector<double>::Length((ChVector<double> *)&msegment);
      if (dVar10 < 1e-09) {
        uVar9 = 0;
      }
    }
    peVar2 = (mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    if (uVar9 < (ulong)((long)(peVar2->lines).
                              super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(peVar2->lines).
                              super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 4)) {
      geometry::ChLinePath::GetSubLineN((ChLinePath *)&mline_prev,(size_t)peVar2);
      sVar15 = geometry::ChLinePath::GetSubLineN
                         ((ChLinePath *)&mline_next,
                          (size_t)(mpath->
                                  super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr);
      dir_prev.m_data[2] = 0.0;
      dir_next.m_data[2] = 0.0;
      msegment.super___shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2> =
           (__shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2>)ZEXT816(0);
      marc.super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2> =
           (__shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>)ZEXT816(0);
      dir_prev.m_data._0_16_ = ZEXT816(0);
      dir_next.m_data[0] = 0.0;
      dir_next.m_data[1] = 0.0;
      (*((mline_prev.super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->super_ChGeometry)._vptr_ChGeometry[0xb])
                (0x3ff0000000000000,
                 mline_prev.super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,&msegment,
                 sVar15.super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      (*((mline_next.super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->super_ChGeometry)._vptr_ChGeometry[0xb])
                (0,mline_next.
                   super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (ChLinePath *)&marc);
      (*((mline_prev.super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->super_ChGeometry)._vptr_ChGeometry[0xc])
                (0x3ff0000000000000,
                 mline_prev.super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr,&dir_prev);
      (*((mline_next.super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->super_ChGeometry)._vptr_ChGeometry[0xc])
                (0,mline_next.
                   super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &dir_next);
      ChVector<double>::Normalize(&dir_prev);
      ChVector<double>::Normalize(&dir_next);
      v_1.m_data._0_16_ =
           vsubpd_avx((undefined1  [16])
                      msegment.
                      super___shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2>
                      ,(undefined1  [16])
                       marc.
                       super___shared_ptr<chrono::geometry::ChLineArc,_(__gnu_cxx::_Lock_policy)2>);
      v_1.m_data[2] = 0.0;
      dVar10 = ChVector<double>::Length(&v_1);
      if (1e-09 < dVar10) {
        pCVar7 = (ChException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string
                  ((string *)&local_b0,
                   "Error! Add2Dpath: ChLinePath must contain sequence of connected segments/arcs, with no gaps"
                   ,(allocator *)&v_1);
        ChException::ChException(pCVar7,&local_b0);
        __cxa_throw(pCVar7,&ChException::typeinfo,ChException::~ChException);
      }
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dir_prev.m_data[0];
      auVar1._8_8_ = 0;
      auVar1._0_8_ = dir_next.m_data[1];
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dir_prev.m_data[1] * dir_next.m_data[0];
      auVar12 = vfmsub231sd_fma(auVar14,auVar13,auVar1);
      if (auVar12._0_8_ < -1e-09) {
        dVar10 = atan2(dir_prev.m_data[1],dir_prev.m_data[0]);
        dVar11 = atan2(dir_next.m_data[1],dir_next.m_data[0]);
        pCVar5 = (ChCollisionShapeBullet *)::operator_new(0x28);
        std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_118,
                   &material->
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>);
        ChCollisionShapeBullet::ChCollisionShapeBullet
                  (pCVar5,PATH2D,(shared_ptr<chrono::ChMaterialSurface> *)&local_118);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_118._M_refcount);
        pcVar6 = (cbt2DarcShape *)cbtConvexInternalShape::operator_new(0x60);
        cbt2DarcShape::cbt2DarcShape
                  (pcVar6,(float)(double)msegment.
                                         super___shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr,
                   (float)(double)msegment.
                                  super___shared_ptr<chrono::geometry::ChLineSegment,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi,0.0,(float)(dVar10 + 1.5707963267948966),
                   (float)(dVar11 + 1.5707963267948966),false,mzthickness);
        pCVar5->m_bt_shape = (cbtCollisionShape *)pcVar6;
        (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])(this);
        (*(pcVar6->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
          _vptr_cbtCollisionShape[0xb])(pcVar6);
        injectShape(this,pos,rot,pCVar5);
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mline_next.
                  super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mline_prev.
                  super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

bool ChCollisionModelBullet::Add2Dpath(std::shared_ptr<ChMaterialSurface> material,
                                       std::shared_ptr<geometry::ChLinePath> mpath,
                                       const ChVector<>& pos,
                                       const ChMatrix33<>& rot,
                                       const double mthickness) {
    // The envelope is not used in this type of collision primitive.
    SetEnvelope(0);

    // if (!mpath.Get_closed())
    //    throw ChException("Error! Add2Dpath requires a CLOSED ChLinePath!");

    for (size_t i = 0; i < mpath->GetSubLinesCount(); ++i) {
        if (auto msegment = std::dynamic_pointer_cast<geometry::ChLineSegment>(mpath->GetSubLineN(i))) {
            if (msegment->pA.z() != msegment->pB.z())
                throw ChException("Error! Add2Dpath: sub segment of ChLinePath not parallel to XY plane!");

            cbtVector3 pa((cbtScalar)msegment->pA.x(), (cbtScalar)msegment->pA.y(), (cbtScalar)0);
            cbtVector3 pb((cbtScalar)msegment->pB.x(), (cbtScalar)msegment->pB.y(), (cbtScalar)0);

            auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::PATH2D, material);
            shape->m_bt_shape = new cbt2DsegmentShape(pa, pb, (cbtScalar)mthickness);
            shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());
            injectShape(pos, rot, shape);
        } else if (auto marc = std::dynamic_pointer_cast<geometry::ChLineArc>(mpath->GetSubLineN(i))) {
            if ((marc->origin.rot.e1() != 0) || (marc->origin.rot.e2() != 0))
                throw ChException("Error! Add2Dpath: a sub arc of ChLinePath not parallel to XY plane!");
            double mangle1 = marc->angle1;
            double mangle2 = marc->angle2;
            if (mangle1 - mangle2 == CH_C_2PI)
                mangle1 -= 1e-7;
            auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::PATH2D, material);
            shape->m_bt_shape = new cbt2DarcShape((cbtScalar)marc->origin.pos.x(), (cbtScalar)marc->origin.pos.y(),
                                                  (cbtScalar)marc->radius, (cbtScalar)mangle1, (cbtScalar)mangle2,
                                                  marc->counterclockwise, (cbtScalar)mthickness);
            shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());
            injectShape(pos, rot, shape);
        } else {
            throw ChException("Error! Add2Dpath: ChLinePath must contain only ChLineArc and/or ChLineSegment.");
        }

        size_t i_prev = i;
        size_t i_next = i + 1;
        if (i_next >= mpath->GetSubLinesCount())
            if ((mpath->GetEndA() - mpath->GetEndB()).Length() <
                1e-9)        // can't use Get_closed() that is user preference via Set_closed()
                i_next = 0;  // closed path
        if (i_next < mpath->GetSubLinesCount()) {
            std::shared_ptr<geometry::ChLine> mline_prev = mpath->GetSubLineN(i_prev);
            std::shared_ptr<geometry::ChLine> mline_next = mpath->GetSubLineN(i_next);
            ChVector<> pos_prev, pos_next;
            ChVector<> dir_prev, dir_next;
            mline_prev->Evaluate(pos_prev, 1);
            mline_next->Evaluate(pos_next, 0);
            mline_prev->Derive(dir_prev, 1);
            mline_next->Derive(dir_next, 0);
            dir_prev.Normalize();
            dir_next.Normalize();

            // check if connected segments
            if ((pos_prev - pos_next).Length() > 1e-9)
                throw ChException(
                    "Error! Add2Dpath: ChLinePath must contain sequence of connected segments/arcs, with no gaps");

            // insert a 0-radius fillet arc at sharp corners, to allow for sharp-corner vs arc/segment
            if (Vcross(dir_prev, dir_next).z() < -1e-9) {
                double mangle1 = atan2(dir_prev.y(), dir_prev.x()) + CH_C_PI_2;
                double mangle2 = atan2(dir_next.y(), dir_next.x()) + CH_C_PI_2;

                auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::PATH2D, material);
                shape->m_bt_shape =
                    new cbt2DarcShape((cbtScalar)pos_prev.x(), (cbtScalar)pos_prev.y(), (cbtScalar)0,
                                      (cbtScalar)mangle1, (cbtScalar)mangle2, false, (cbtScalar)mthickness);
                shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());
                injectShape(pos, rot, shape);
                // GetLog() << "convex corner between " << i_next << " and " << i_next << " w.angles: " << mangle1 << "
                // " << mangle2 << "\n";
            } else {
                // GetLog() << "concave corner between " << i_next << " and " << i_next << "\n";
            }
        }
    }

    return true;
}